

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O0

void ARipper::InPlaceConstructor(void *mem)

{
  ARipper *this;
  void *mem_local;
  
  this = (ARipper *)DObject::operator_new(0x4a0,(EInPlace *)mem);
  ARipper(this);
  return;
}

Assistant:

int ARipper::DoSpecialDamage (AActor *target, int damage, FName damagetype)
{
	if (target->IsKindOf (PClass::FindClass ("Ironlich")))
	{ // Less damage to Ironlich bosses
		damage = pr_ripd() & 1;
		if (!damage)
		{
			return -1;
		}
	}
	return damage;
}